

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O0

PixelFormat deqp::egl::getPixelFormat(Library *egl,EGLDisplay display,EGLConfig config)

{
  EGLConfig config_local;
  EGLDisplay display_local;
  Library *egl_local;
  PixelFormat pixelFmt;
  
  tcu::PixelFormat::PixelFormat((PixelFormat *)&egl_local);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3024,(PixelFormat *)&egl_local);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3023,(long)&egl_local + 4);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3022,&pixelFmt);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3021,&pixelFmt.greenBits);
  return _egl_local;
}

Assistant:

static tcu::PixelFormat getPixelFormat (const Library& egl, EGLDisplay display, EGLConfig config)
{
	tcu::PixelFormat pixelFmt;

	egl.getConfigAttrib(display, config, EGL_RED_SIZE,		&pixelFmt.redBits);
	egl.getConfigAttrib(display, config, EGL_GREEN_SIZE,	&pixelFmt.greenBits);
	egl.getConfigAttrib(display, config, EGL_BLUE_SIZE,		&pixelFmt.blueBits);
	egl.getConfigAttrib(display, config, EGL_ALPHA_SIZE,	&pixelFmt.alphaBits);

	return pixelFmt;
}